

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

void cfd::capi::ConvertToKeyData
               (string *pubkey,char *fingerprint,char *bip32_path,
               vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  bool bVar1;
  byte bVar2;
  size_t sVar3;
  undefined8 uVar4;
  KeyData *in_RCX;
  Pubkey *in_RDX;
  ByteData *in_RSI;
  string *in_RDI;
  CfdException *anon_var_0;
  Descriptor desc;
  KeyData key_data;
  KeyData *in_stack_fffffffffffff8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a8;
  string *in_stack_fffffffffffff8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  undefined8 in_stack_fffffffffffff8b8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff8c0;
  allocator *this;
  string local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c9;
  ByteData local_6a8;
  allocator local_689;
  string local_688 [32];
  Pubkey local_668;
  undefined1 local_64a;
  allocator local_649;
  string local_648 [32];
  CfdSourceLocation local_628;
  undefined1 local_60a;
  allocator local_609;
  string local_608 [32];
  CfdSourceLocation local_5e8;
  byte local_5c9;
  ByteData local_5c8;
  string local_5b0;
  KeyData local_590;
  KeyData local_438;
  Descriptor local_2d8;
  KeyData local_170;
  KeyData *local_20;
  Pubkey *local_18;
  ByteData *local_10;
  string *local_8;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  core::KeyData::KeyData(&local_170);
  core::Descriptor::Parse
            (&local_2d8,local_8,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  core::Descriptor::GetKeyData(&local_438,&local_2d8);
  core::KeyData::operator=(&local_170,&local_438);
  core::KeyData::~KeyData(in_stack_fffffffffffff8a0);
  core::Descriptor::~Descriptor((Descriptor *)0x5ee285);
  bVar1 = core::KeyData::IsValid(&local_170);
  if (!bVar1) {
    core::KeyData::KeyData(&local_590,local_8,-1,false);
    core::KeyData::operator=(&local_170,&local_590);
    core::KeyData::~KeyData(in_stack_fffffffffffff8a0);
  }
  local_5c9 = 0;
  core::KeyData::GetBip32Path_abi_cxx11_(&local_5b0,&local_170,kApostrophe,false);
  bVar2 = std::__cxx11::string::empty();
  bVar1 = true;
  if ((bVar2 & 1) == 0) {
    core::KeyData::GetFingerprint(&local_5c8,&local_170);
    local_5c9 = 1;
    sVar3 = core::ByteData::GetDataSize(&local_5c8);
    bVar1 = sVar3 != 4;
  }
  if ((local_5c9 & 1) != 0) {
    core::ByteData::~ByteData((ByteData *)0x5ee409);
  }
  std::__cxx11::string::~string((string *)&local_5b0);
  if (bVar1) {
    bVar1 = IsEmptyString((char *)local_10);
    if (bVar1) {
      local_5e8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_5e8.filename = local_5e8.filename + 1;
      local_5e8.line = 0xd7;
      local_5e8.funcname = "ConvertToKeyData";
      core::logger::warn<>(&local_5e8,"fingerprint is null or empty.");
      local_60a = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_608,"Failed to parameter. fingerprint is null or empty.",&local_609);
      core::CfdException::CfdException
                (in_stack_fffffffffffff8c0,error_code,in_stack_fffffffffffff8b0);
      local_60a = 0;
      __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    bVar1 = IsEmptyString((char *)local_18);
    if (bVar1) {
      local_628.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_628.filename = local_628.filename + 1;
      local_628.line = 0xdd;
      local_628.funcname = "ConvertToKeyData";
      core::logger::warn<>(&local_628,"bip32_path is null or empty.");
      local_64a = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_648,"Failed to parameter. bip32_path is null or empty.",&local_649);
      core::CfdException::CfdException
                (in_stack_fffffffffffff8c0,error_code,in_stack_fffffffffffff8b0);
      local_64a = 0;
      __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Pubkey::Pubkey(&local_668,local_8);
    this = &local_689;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_688,(char *)local_18,this);
    __args_1 = &local_6c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_6c9.field_0x1,(char *)local_10,(allocator *)__args_1);
    core::ByteData::ByteData(&local_6a8,(string *)&local_6c9.field_0x1);
    std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
    emplace_back<cfd::core::Pubkey,std::__cxx11::string,cfd::core::ByteData>
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)this,local_18,
               __args_1,local_10);
    core::ByteData::~ByteData((ByteData *)0x5ee7f0);
    std::__cxx11::string::~string((string *)&local_6c9.field_0x1);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
    std::__cxx11::string::~string(local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
    core::Pubkey::~Pubkey((Pubkey *)0x5ee831);
  }
  else {
    core::KeyData::ToString_abi_cxx11_(&local_6f0,&local_170,true,kApostrophe,false);
    std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
    emplace_back<std::__cxx11::string>
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    std::__cxx11::string::~string((string *)&local_6f0);
    in_stack_fffffffffffff8a0 = local_20;
  }
  core::KeyData::~KeyData(in_stack_fffffffffffff8a0);
  return;
}

Assistant:

static void ConvertToKeyData(
    const std::string& pubkey, const char* fingerprint, const char* bip32_path,
    std::vector<KeyData>* key_list) {
  KeyData key_data;
  try {
    auto desc = Descriptor::Parse(pubkey);
    key_data = desc.GetKeyData();
  } catch (const CfdException&) {
    // fall through
  }
  if (!key_data.IsValid()) key_data = KeyData(pubkey);

  if (key_data.GetBip32Path().empty() ||
      (key_data.GetFingerprint().GetDataSize() != 4)) {
    if (IsEmptyString(fingerprint)) {
      warn(CFD_LOG_SOURCE, "fingerprint is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fingerprint is null or empty.");
    }
    if (IsEmptyString(bip32_path)) {
      warn(CFD_LOG_SOURCE, "bip32_path is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. bip32_path is null or empty.");
    }
    key_list->emplace_back(
        Pubkey(pubkey), std::string(bip32_path), ByteData(fingerprint));
  } else {
    key_list->emplace_back(key_data.ToString());
  }
}